

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void allocate_imp_vec<ImputedData<int,double>,InputData<float,int>>
               (vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                *impute_vec,InputData<float,_int> *input_data,int nthreads)

{
  long lVar1;
  size_t row;
  ulong row_00;
  
  std::vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>::resize
            (impute_vec,input_data->nrows);
  lVar1 = 0;
  for (row_00 = 0; row_00 < input_data->nrows; row_00 = row_00 + 1) {
    if ((input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[row_00] != '\0') {
      initialize_impute_calc<ImputedData<int,double>,InputData<float,int>>
                ((ImputedData<int,_double> *)
                 ((long)&(((impute_vec->
                           super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->num_sum).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar1),
                 input_data,row_00);
    }
    lVar1 = lVar1 + 0xf0;
  }
  return;
}

Assistant:

void allocate_imp_vec(std::vector<ImputedData> &impute_vec, InputData &input_data, int nthreads)
{
    impute_vec.resize(input_data.nrows);
    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) shared(impute_vec, input_data)
    for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
        if (input_data.has_missing[row])
            initialize_impute_calc(impute_vec[row], input_data, row);
}